

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O1

void __thiscall FBehavior::UnencryptStrings(FBehavior *this)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  int *piVar4;
  int *piVar5;
  ulong uVar6;
  ulong uVar7;
  byte bVar8;
  
  piVar5 = (int *)this->Chunks;
  if (piVar5 != (int *)0x0) {
    for (; piVar5 < this->Data + this->DataSize;
        piVar5 = (int *)((long)piVar5 + (ulong)(piVar5[1] + 8))) {
      if (*piVar5 == 0x45525453) goto LAB_003b0e29;
    }
  }
  piVar5 = (int *)0x0;
LAB_003b0e29:
  if (piVar5 == (int *)0x0) {
    piVar4 = (int *)0x0;
  }
  else {
    do {
      piVar4 = piVar5;
      if (piVar4[3] != 0) {
        uVar6 = 0;
        do {
          iVar2 = piVar4[(int)uVar6 + 5];
          lVar3 = (long)iVar2 + 8;
          uVar7 = 0;
          do {
            bVar8 = (char)(uVar7 >> 1) + (char)iVar2 * -0x31;
            bVar1 = *(byte *)((long)piVar4 + uVar7 + lVar3);
            *(byte *)((long)piVar4 + uVar7 + lVar3) = bVar1 ^ bVar8;
            uVar7 = uVar7 + 1;
          } while (bVar1 != bVar8);
          uVar6 = uVar6 + 1;
        } while (uVar6 < (uint)piVar4[3]);
      }
      piVar5 = (int *)((ulong)(piVar4[1] + 8) + (long)piVar4);
      if (piVar5 < this->Data + this->DataSize) {
        do {
          if (*piVar5 == *piVar4) goto LAB_003b0eb3;
          piVar5 = (int *)((long)piVar5 + (ulong)(piVar5[1] + 8));
        } while (piVar5 < this->Data + this->DataSize);
      }
      piVar5 = (int *)0x0;
LAB_003b0eb3:
      *piVar4 = 0x4c525453;
    } while (piVar5 != (int *)0x0);
  }
  if (piVar4 != (int *)0x0) {
    *piVar4 = 0x4c525453;
  }
  return;
}

Assistant:

BYTE *FBehavior::FindChunk (DWORD id) const
{
	BYTE *chunk = Chunks;

	while (chunk != NULL && chunk < Data + DataSize)
	{
		if (((DWORD *)chunk)[0] == id)
		{
			return chunk;
		}
		chunk += LittleLong(((DWORD *)chunk)[1]) + 8;
	}
	return NULL;
}